

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::EventLoop::run(EventLoop *this,uint maxTurnCount)

{
  bool bVar1;
  int iVar2;
  
  this->running = true;
  iVar2 = maxTurnCount + 1;
  do {
    iVar2 = iVar2 + -1;
    if (iVar2 == 0) break;
    bVar1 = turn(this);
  } while (bVar1);
  setRunnable(this,this->head != (Event *)0x0);
  this->running = false;
  return;
}

Assistant:

void EventLoop::run(uint maxTurnCount) {
  running = true;
  KJ_DEFER(running = false);

  for (uint i = 0; i < maxTurnCount; i++) {
    if (!turn()) {
      break;
    }
  }

  setRunnable(isRunnable());
}